

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.cpp
# Opt level: O2

void __thiscall chrono::ChTimestepper::ArchiveOUT(ChTimestepper *this,ChArchiveOut *archive)

{
  Type type;
  Type_mapper_conflict typemapper;
  Type local_bc;
  ChEnumMapper<chrono::ChTimestepper::Type> local_b8;
  ChEnumMapper<chrono::ChTimestepper::Type> local_98;
  ChNameValue<double> local_78;
  ChNameValue<bool> local_60;
  ChNameValue<bool> local_48;
  ChNameValue<chrono::ChEnumMapper<chrono::ChTimestepper::Type>_> local_30;
  
  ChArchiveOut::VersionWrite<chrono::ChTimestepper>(archive);
  my_enum_mappers::Type_mapper::Type_mapper((Type_mapper *)&local_b8);
  local_bc = (*this->_vptr_ChTimestepper[2])(this);
  my_enum_mappers::Type_mapper::operator()(&local_98,(Type_mapper *)&local_b8,&local_bc);
  local_30._name = "timestepper_type";
  local_30._flags = '\0';
  local_30._value = &local_98;
  ChArchiveOut::operator<<(archive,&local_30);
  ChEnumMapper<chrono::ChTimestepper::Type>::~ChEnumMapper(&local_98);
  local_48._value = &this->verbose;
  local_48._name = "verbose";
  local_48._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_48);
  local_60._value = &this->Qc_do_clamp;
  local_60._name = "Qc_do_clamp";
  local_60._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_60);
  local_78._value = &this->Qc_clamping;
  local_78._name = "Qc_clamping";
  local_78._flags = '\0';
  ChArchiveOut::operator<<(archive,&local_78);
  ChEnumMapper<chrono::ChTimestepper::Type>::~ChEnumMapper(&local_b8);
  return;
}

Assistant:

void ChTimestepper::ArchiveOUT(ChArchiveOut& archive) {
    // version number
    archive.VersionWrite<ChTimestepper>();
    // method type:
    my_enum_mappers::Type_mapper typemapper;
    Type type = GetType();
    archive << CHNVP(typemapper(type), "timestepper_type");
    // serialize all member data:
    archive << CHNVP(verbose);
    archive << CHNVP(Qc_do_clamp);
    archive << CHNVP(Qc_clamping);
}